

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ScalarReplacementPass::TransferAnnotations
          (ScalarReplacementPass *this,Instruction *source,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  Instruction *this_01;
  Instruction *this_02;
  uint32_t uVar2;
  array<signed_char,_4UL> aVar3;
  array<signed_char,_4UL> aVar4;
  Analysis AVar5;
  Instruction *this_03;
  Operand *pOVar6;
  IRContext *pIVar7;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_04;
  uint uVar8;
  pointer ppIVar9;
  long lVar10;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range4;
  undefined1 local_138 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_110;
  undefined4 local_108;
  undefined1 local_100 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e0;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_d8;
  pointer local_d0;
  pointer local_c8;
  pointer local_c0;
  undefined1 local_b8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_98;
  undefined1 local_90 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  local_d8 = replacements;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  this_00 = (pIVar1->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar2 = 0;
  if (source->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(source,(uint)source->has_type_id_);
  }
  analysis::DecorationManager::GetDecorationsFor(&local_48,this_00,uVar2,false);
  local_d0 = local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar9 = local_48.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_01 = *ppIVar9;
      local_c8 = ppIVar9;
      if (this_01->opcode_ != OpDecorate) {
        __assert_fail("inst->opcode() == spv::Op::OpDecorate",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                      ,0x1bd,
                      "void spvtools::opt::ScalarReplacementPass::TransferAnnotations(const Instruction *, std::vector<Instruction *> *)"
                     );
      }
      uVar8 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar8 = (uint)this_01->has_result_id_;
      }
      aVar3._M_elems = (_Type)Instruction::GetSingleWordOperand(this_01,uVar8 + 1);
      if (((uint)aVar3._M_elems & 0xfffffffe) == 0x12) {
        ppIVar9 = (local_d8->
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_c0 = (local_d8->
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        if (ppIVar9 != local_c0) {
          do {
            this_02 = *ppIVar9;
            if (this_02 != (Instruction *)0x0) {
              this_03 = (Instruction *)operator_new(0x70);
              pIVar1 = (this->super_MemPass).super_Pass.context_;
              aVar4._M_elems[0] = '\0';
              aVar4._M_elems[1] = '\0';
              aVar4._M_elems[2] = '\0';
              aVar4._M_elems[3] = '\0';
              if (this_02->has_result_id_ == true) {
                aVar4._M_elems =
                     (_Type)Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
              }
              local_90._0_8_ = &PTR__SmallVector_00b02ef8;
              local_90._24_8_ = local_90 + 0x10;
              local_70._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
              local_90._8_8_ = 1;
              local_138._0_4_ = SPV_OPERAND_TYPE_ID;
              local_138._8_8_ = &PTR__SmallVector_00b02ef8;
              local_138._16_8_ = 0;
              local_138._32_8_ = local_138 + 0x18;
              local_110._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
              local_90._16_4_ = aVar4._M_elems;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)(local_138 + 8),
                         (SmallVector<unsigned_int,_2UL> *)local_90);
              local_b8._0_8_ = &PTR__SmallVector_00b02ef8;
              local_b8._24_8_ = local_b8 + 0x10;
              local_98._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
              local_b8._8_8_ = 1;
              local_108 = 0x1c;
              local_100._0_8_ = &PTR__SmallVector_00b02ef8;
              local_100._8_8_ = 0;
              local_100._24_8_ = local_100 + 0x10;
              local_e0._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
              local_b8._16_4_ = aVar3._M_elems;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)local_100,
                         (SmallVector<unsigned_int,_2UL> *)local_b8);
              local_68 = 0;
              uStack_60 = 0;
              local_58 = 0;
              std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
              _M_range_initialize<spvtools::opt::Operand_const*>
                        ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                         &local_68,local_138,&local_d8);
              Instruction::Instruction(this_03,pIVar1,OpDecorate,0,0,(OperandList *)&local_68);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                        ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                         &local_68);
              lVar10 = -0x60;
              this_04 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
                        )&local_e0;
              do {
                *(undefined ***)(this_04 + -0x20) = &PTR__SmallVector_00b02ef8;
                if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_04 !=
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()(this_04,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                                      this_04);
                }
                *(undefined8 *)this_04 = 0;
                this_04 = this_04 + -0x30;
                lVar10 = lVar10 + 0x30;
              } while (lVar10 != 0);
              local_b8._0_8_ = &PTR__SmallVector_00b02ef8;
              if (local_98._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl !=
                  (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_98,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           local_98._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl);
              }
              local_90._0_8_ = &PTR__SmallVector_00b02ef8;
              if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )local_70._M_t.
                    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                    ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_70,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           local_70._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl);
              }
              uVar8 = (this_01->has_result_id_ & 1) + 1;
              if (this_01->has_type_id_ == false) {
                uVar8 = (uint)this_01->has_result_id_;
              }
              if (2 < (int)((ulong)((long)(this_01->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_01->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar8) {
                uVar2 = 2;
                do {
                  pOVar6 = Instruction::GetInOperand(this_01,uVar2);
                  local_138._0_4_ = pOVar6->type;
                  local_138._8_8_ = &PTR__SmallVector_00b02ef8;
                  local_138._16_8_ = 0;
                  local_138._32_8_ = local_138 + 0x18;
                  local_110._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
                  utils::SmallVector<unsigned_int,_2UL>::operator=
                            ((SmallVector<unsigned_int,_2UL> *)(local_138 + 8),&pOVar6->words);
                  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                  emplace_back<spvtools::opt::Operand>(&this_03->operands_,(Operand *)local_138);
                  local_138._8_8_ = &PTR__SmallVector_00b02ef8;
                  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )local_110._M_t.
                        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        .
                        super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                        ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
                  {
                    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                    operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&local_110,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               local_110._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl);
                  }
                  uVar2 = uVar2 + 1;
                  uVar8 = (this_01->has_result_id_ & 1) + 1;
                  if (this_01->has_type_id_ == false) {
                    uVar8 = (uint)this_01->has_result_id_;
                  }
                } while (uVar2 < (int)((ulong)((long)(this_01->operands_).
                                                                                                          
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_01->operands_).
                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                 -0x55555555 - uVar8);
              }
              pIVar1 = (this->super_MemPass).super_Pass.context_;
              AVar5 = pIVar1->valid_analyses_;
              if ((AVar5 & kAnalysisDecorations) != kAnalysisNone) {
                analysis::DecorationManager::AddDecoration
                          ((pIVar1->decoration_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                           .
                           super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>
                           ._M_head_impl,this_03);
                AVar5 = pIVar1->valid_analyses_;
              }
              if ((AVar5 & kAnalysisBegin) != kAnalysisNone) {
                analysis::DefUseManager::AnalyzeInstDefUse
                          ((pIVar1->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,this_03);
              }
              utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                        (&(((pIVar1->module_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                          annotations_).super_IntrusiveList<spvtools::opt::Instruction>,this_03);
              pIVar1 = (this->super_MemPass).super_Pass.context_;
              pIVar7 = pIVar1;
              if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar1);
                pIVar7 = (this->super_MemPass).super_Pass.context_;
              }
              analysis::DefUseManager::AnalyzeInstUse
                        ((pIVar1->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,
                         *(Instruction **)
                          ((long)&(((pIVar7->module_)._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                   _M_head_impl)->annotations_).
                                  super_IntrusiveList<spvtools::opt::Instruction> + 0x18));
            }
            ppIVar9 = ppIVar9 + 1;
          } while (ppIVar9 != local_c0);
        }
      }
      ppIVar9 = local_c8 + 1;
    } while (local_c8 + 1 != local_d0);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ScalarReplacementPass::TransferAnnotations(
    const Instruction* source, std::vector<Instruction*>* replacements) {
  // Only transfer invariant and restrict decorations on the variable. There are
  // no type or member decorations that are necessary to transfer.
  for (auto inst :
       get_decoration_mgr()->GetDecorationsFor(source->result_id(), false)) {
    assert(inst->opcode() == spv::Op::OpDecorate);
    auto decoration = spv::Decoration(inst->GetSingleWordInOperand(1u));
    if (decoration == spv::Decoration::Invariant ||
        decoration == spv::Decoration::Restrict) {
      for (auto var : *replacements) {
        if (var == nullptr) {
          continue;
        }

        std::unique_ptr<Instruction> annotation(new Instruction(
            context(), spv::Op::OpDecorate, 0, 0,
            std::initializer_list<Operand>{
                {SPV_OPERAND_TYPE_ID, {var->result_id()}},
                {SPV_OPERAND_TYPE_DECORATION, {uint32_t(decoration)}}}));
        for (uint32_t i = 2; i < inst->NumInOperands(); ++i) {
          Operand copy(inst->GetInOperand(i));
          annotation->AddOperand(std::move(copy));
        }
        context()->AddAnnotationInst(std::move(annotation));
        get_def_use_mgr()->AnalyzeInstUse(&*--context()->annotation_end());
      }
    }
  }
}